

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

ssize_t __thiscall Instance::write(Instance *this,int __fd,void *__buf,size_t __n)

{
  pointer pIVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ssize_t extraout_RAX;
  int *piVar5;
  undefined4 in_register_00000034;
  FILE *__s;
  int i;
  long lVar6;
  ulong uVar7;
  int t;
  int i_00;
  long lVar8;
  int iVar9;
  allocator_type local_51;
  long local_50;
  vector<int,_std::allocator<int>_> rid;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  fwrite("#INSTANCE_BEGIN#\n",0x11,1,__s);
  fwrite("$INSTANCE{\n",0xb,1,__s);
  fprintf(__s,"%d\n",(ulong)(uint)this->ndims);
  fprintf(__s,"%d\n",(ulong)(uint)this->nbtypes);
  for (lVar8 = 0; lVar8 < this->nbtypes; lVar8 = lVar8 + 1) {
    for (lVar6 = 0; lVar6 < this->ndims; lVar6 = lVar6 + 1) {
      fprintf(__s," %d",
              (ulong)*(uint *)(*(long *)&(this->Ws).
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + lVar6 * 4));
    }
    fprintf(__s," %d",
            (ulong)(uint)(this->Cs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar8]);
    fprintf(__s," %d\n",
            (ulong)(uint)(this->Qs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar8]);
  }
  uVar7 = 0;
  fprintf(__s,"%d\n",(ulong)(uint)this->m);
  std::vector<int,_std::allocator<int>_>::vector
            (&rid,((long)(this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x48,&local_51);
  pIVar1 = (this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->items).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pIVar1) / 0x48;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar7;
  }
  piVar5 = &pIVar1->id;
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    rid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [*piVar5] = (int)uVar7;
    piVar5 = piVar5 + 0x12;
  }
  lVar8 = 0;
  lVar6 = 0;
  while (lVar6 < this->m) {
    fprintf(__s,"%d %d\n",
            (ulong)(uint)(this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6],
            (ulong)(uint)(this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6]);
    lVar8 = (long)(int)lVar8;
    local_50 = lVar6;
    for (iVar9 = 0;
        iVar9 < (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[local_50]; iVar9 = iVar9 + 1) {
      for (i_00 = 0; i_00 < this->ndims; i_00 = i_00 + 1) {
        uVar2 = Item::operator[]((this->items).super__Vector_base<Item,_std::allocator<Item>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                                 rid.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar8],i_00);
        fprintf(__s," %d",(ulong)uVar2);
      }
      fputc(10,__s);
      lVar8 = lVar8 + 1;
    }
    lVar6 = local_50 + 1;
  }
  fwrite("};\n",3,1,__s);
  fprintf(__s,"$VTYPE{%c};\n",(ulong)(uint)(int)this->vtype);
  fwrite("$CTYPE{",7,1,__s);
  for (lVar8 = 0; lVar8 < this->m; lVar8 = lVar8 + 1) {
    if (lVar8 != 0) {
      fputc(0x2c,__s);
    }
    fputc((int)(this->ctypes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8],__s);
  }
  fwrite("};\n",3,1,__s);
  fprintf(__s,"$METHOD{%d};\n",(ulong)(uint)this->method);
  fprintf(__s,"$RELAX{%d};\n",(ulong)this->relax_domains);
  fprintf(__s,"$BINARY{%d};\n",(ulong)this->binary);
  fwrite("#INSTANCE_END#\n",0xf,1,__s);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&rid.super__Vector_base<int,_std::allocator<int>_>);
  return extraout_RAX;
}

Assistant:

void Instance::write(FILE *fout) const {
	fprintf(fout, "#INSTANCE_BEGIN#\n");
	fprintf(fout, "$INSTANCE{\n");
	fprintf(fout, "%d\n", ndims);

	fprintf(fout, "%d\n", nbtypes);

	for (int t = 0; t < nbtypes; t++) {
		for (int i = 0; i < ndims; i++) {
			fprintf(fout, " %d", Ws[t][i]);
		}
		fprintf(fout, " %d", Cs[t]);
		fprintf(fout, " %d\n", Qs[t]);
	}

	fprintf(fout, "%d\n", m);
	int p = 0;
	std::vector<int> rid(items.size());
	for (int it = 0; it < static_cast<int>(items.size()); it++) {
		rid[items[it].id] = it;
	}
	for (int i = 0; i < m; i++) {
		fprintf(fout, "%d %d\n", nopts[i], demands[i]);
		for (int q = 0; q < nopts[i]; q++) {
			for (int j = 0; j < ndims; j++) {
				fprintf(fout, " %d", items[rid[p]][j]);
			}
			fprintf(fout, "\n");
			p++;
		}
	}
	fprintf(fout, "};\n");

	fprintf(fout, "$VTYPE{%c};\n", vtype);

	fprintf(fout, "$CTYPE{");
	for (int i = 0; i < m; i++) {
		if (i) fprintf(fout, ",");
		fprintf(fout, "%c", ctypes[i]);
	}
	fprintf(fout, "};\n");

	fprintf(fout, "$METHOD{%d};\n", method);

	fprintf(fout, "$RELAX{%d};\n", relax_domains);

	fprintf(fout, "$BINARY{%d};\n", binary);

	fprintf(fout, "#INSTANCE_END#\n");
}